

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::EnsureDebugManager(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *alloc;
  DebugManager *this_00;
  AllocationPolicyManager *allocationPolicyManager;
  undefined4 *puVar3;
  TrackAllocData local_38;
  ThreadContext *local_10;
  ThreadContext *this_local;
  
  local_10 = this;
  if (this->debugManager == (DebugManager *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&Js::DebugManager::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0x8e1);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
    this_00 = (DebugManager *)new<Memory::HeapAllocator>(0x218,alloc,0x350bd0);
    allocationPolicyManager = GetAllocationPolicyManager(this);
    Js::DebugManager::DebugManager(this_00,this,allocationPolicyManager);
    this->debugManager = this_00;
  }
  InterlockedIncrement(&this->crefSContextForDiag);
  if (this->debugManager == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8e4,"(this->debugManager != nullptr)","this->debugManager != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ThreadContext::EnsureDebugManager()
{
    if (this->debugManager == nullptr)
    {
        this->debugManager = HeapNew(Js::DebugManager, this, this->GetAllocationPolicyManager());
    }
    InterlockedIncrement(&crefSContextForDiag);
    Assert(this->debugManager != nullptr);
}